

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
llvm::ItaniumPartialDemangler::ItaniumPartialDemangler(ItaniumPartialDemangler *this)

{
  Db *this_00;
  ItaniumPartialDemangler *this_local;
  
  this->RootNode = (void *)0x0;
  this_00 = (Db *)operator_new(0x1300);
  anon_unknown.dwarf_2f151d::Db::Db(this_00,(char *)0x0,(char *)0x0);
  this->Context = this_00;
  return;
}

Assistant:

ItaniumPartialDemangler::ItaniumPartialDemangler()
    : RootNode(nullptr), Context(new Db{nullptr, nullptr}) {}